

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

int Dar_RefactTryGraph(Aig_Man_t *pAig,Aig_Obj_t *pRoot,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph,
                      int NodeMax,int LevelMax)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  void *pvVar3;
  Kit_Node_t *pKVar4;
  Kit_Node_t *pKVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  uint local_74;
  int LevelOld;
  int LevelNew;
  int Counter;
  int i;
  Aig_Obj_t *pAnd1;
  Aig_Obj_t *pAnd0;
  Aig_Obj_t *pAnd;
  Kit_Node_t *pNode1;
  Kit_Node_t *pNode0;
  Kit_Node_t *pNode;
  int LevelMax_local;
  int NodeMax_local;
  Kit_Graph_t *pGraph_local;
  Vec_Ptr_t *vCut_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Kit_GraphIsConst(pGraph);
  if ((iVar1 == 0) && (iVar1 = Kit_GraphIsVar(pGraph), iVar1 == 0)) {
    for (LevelNew = 0; LevelNew < pGraph->nLeaves; LevelNew = LevelNew + 1) {
      pKVar2 = Kit_GraphNode(pGraph,LevelNew);
      pvVar3 = Vec_PtrEntry(vCut,LevelNew);
      (pKVar2->field_2).pFunc = pvVar3;
      pAVar6 = Aig_Regular((Aig_Obj_t *)(pKVar2->field_2).pFunc);
      *(uint *)&pKVar2->field_0x10 =
           *(uint *)&pKVar2->field_0x10 & 0xffffc000 |
           (uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0x3fff;
      pAVar6 = Aig_Regular((Aig_Obj_t *)(pKVar2->field_2).pFunc);
      if (0xfffffe < ((uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff)) {
        __assert_fail("Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darRefact.c"
                      ,0xf1,
                      "int Dar_RefactTryGraph(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Kit_Graph_t *, int, int)"
                     );
      }
    }
    LevelOld = 0;
    for (LevelNew = pGraph->nLeaves; LevelNew < pGraph->nSize; LevelNew = LevelNew + 1) {
      pKVar2 = Kit_GraphNode(pGraph,LevelNew);
      pKVar4 = Kit_GraphNode(pGraph,(uint)pKVar2->eEdge0 >> 1 & 0x3fffffff);
      pKVar5 = Kit_GraphNode(pGraph,(uint)pKVar2->eEdge1 >> 1 & 0x3fffffff);
      pAnd1 = (Aig_Obj_t *)(pKVar4->field_2).pFunc;
      _Counter = (Aig_Obj_t *)(pKVar5->field_2).pFunc;
      if ((pAnd1 == (Aig_Obj_t *)0x0) || (_Counter == (Aig_Obj_t *)0x0)) {
        pAnd0 = (Aig_Obj_t *)0x0;
      }
      else {
        pAnd1 = Aig_NotCond(pAnd1,(uint)pKVar2->eEdge0 & 1);
        _Counter = Aig_NotCond(_Counter,(uint)pKVar2->eEdge1 & 1);
        pAnd0 = Aig_TableLookupTwo(pAig,pAnd1,_Counter);
        pAVar6 = Aig_Regular(pAnd0);
        if (pAVar6 == pRoot) {
          return -1;
        }
      }
      if (pAnd0 == (Aig_Obj_t *)0x0) {
LAB_005d8a73:
        LevelOld = LevelOld + 1;
        if (NodeMax < LevelOld) {
          return -1;
        }
      }
      else {
        pAVar6 = Aig_Regular(pAnd0);
        iVar1 = Aig_ObjIsTravIdCurrent(pAig,pAVar6);
        if (iVar1 != 0) goto LAB_005d8a73;
      }
      iVar1 = Abc_MaxInt(*(uint *)&pKVar4->field_0x10 & 0x3fff,*(uint *)&pKVar5->field_0x10 & 0x3fff
                        );
      local_74 = iVar1 + 1;
      if (pAnd0 != (Aig_Obj_t *)0x0) {
        pAVar6 = Aig_Regular(pAnd0);
        pAVar7 = Aig_ManConst1(pAig);
        if (pAVar6 == pAVar7) {
          local_74 = 0;
        }
        else {
          pAVar6 = Aig_Regular(pAnd0);
          pAVar7 = Aig_Regular(pAnd1);
          if (pAVar6 == pAVar7) {
            pAVar6 = Aig_Regular(pAnd1);
            local_74 = (uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff;
          }
          else {
            pAVar6 = Aig_Regular(pAnd0);
            pAVar7 = Aig_Regular(_Counter);
            if (pAVar6 == pAVar7) {
              pAVar6 = Aig_Regular(_Counter);
              local_74 = (uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff;
            }
          }
        }
        Aig_Regular(pAnd0);
      }
      if (LevelMax < (int)local_74) {
        return -1;
      }
      (pKVar2->field_2).pFunc = pAnd0;
      *(uint *)&pKVar2->field_0x10 = *(uint *)&pKVar2->field_0x10 & 0xffffc000 | local_74 & 0x3fff;
    }
    pAig_local._4_4_ = LevelOld;
  }
  else {
    pAig_local._4_4_ = 0;
  }
  return pAig_local._4_4_;
}

Assistant:

int Dar_RefactTryGraph( Aig_Man_t * pAig, Aig_Obj_t * pRoot, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph, int NodeMax, int LevelMax )
{
    Kit_Node_t * pNode, * pNode0, * pNode1;
    Aig_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, Counter, LevelNew, LevelOld;
    // check for constant function or a literal
    if ( Kit_GraphIsConst(pGraph) || Kit_GraphIsVar(pGraph) )
        return 0;
    // set the levels of the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry(vCut, i);
        pNode->Level = Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level;
        assert( Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1 );
    }
//printf( "Trying:\n" );
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Kit_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Kit_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Aig_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Aig_Obj_t *)pNode1->pFunc; 
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Aig_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Aig_NotCond( pAnd1, pNode->eEdge1.fCompl );
            pAnd  = Aig_TableLookupTwo( pAig, pAnd0, pAnd1 );
            // return -1 if the node is the same as the original root
            if ( Aig_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Aig_ObjIsTravIdCurrent(pAig, Aig_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        // count the number of new levels
        LevelNew = 1 + Abc_MaxInt( pNode0->Level, pNode1->Level );
        if ( pAnd )
        {
            if ( Aig_Regular(pAnd) == Aig_ManConst1(pAig) )
                LevelNew = 0;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd0) )
                LevelNew = (int)Aig_Regular(pAnd0)->Level;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd1) )
                LevelNew = (int)Aig_Regular(pAnd1)->Level;
            LevelOld = (int)Aig_Regular(pAnd)->Level;
//            assert( LevelNew == LevelOld );
        }
        if ( LevelNew > LevelMax )
            return -1;
        pNode->pFunc = pAnd;
        pNode->Level = LevelNew;
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    return Counter;
}